

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O0

void xmlSchemaConstructionCtxtFree(xmlSchemaConstructionCtxtPtr con)

{
  xmlSchemaConstructionCtxtPtr con_local;
  
  if (con->buckets != (xmlSchemaItemListPtr)0x0) {
    xmlSchemaItemListFree(con->buckets);
  }
  if (con->pending != (xmlSchemaItemListPtr)0x0) {
    xmlSchemaItemListFree(con->pending);
  }
  if (con->substGroups != (xmlHashTablePtr)0x0) {
    xmlHashFree(con->substGroups,xmlSchemaSubstGroupFreeEntry);
  }
  if (con->redefs != (xmlSchemaRedefPtr_conflict)0x0) {
    xmlSchemaRedefListFree(con->redefs);
  }
  if (con->dict != (xmlDictPtr)0x0) {
    xmlDictFree(con->dict);
  }
  (*xmlFree)(con);
  return;
}

Assistant:

static void
xmlSchemaConstructionCtxtFree(xmlSchemaConstructionCtxtPtr con)
{
    /*
    * After the construction context has been freed, there will be
    * no schema graph available any more. Only the schema buckets
    * will stay alive, which are put into the "schemasImports" and
    * "includes" slots of the xmlSchema.
    */
    if (con->buckets != NULL)
	xmlSchemaItemListFree(con->buckets);
    if (con->pending != NULL)
	xmlSchemaItemListFree(con->pending);
    if (con->substGroups != NULL)
	xmlHashFree(con->substGroups, xmlSchemaSubstGroupFreeEntry);
    if (con->redefs != NULL)
	xmlSchemaRedefListFree(con->redefs);
    if (con->dict != NULL)
	xmlDictFree(con->dict);
    xmlFree(con);
}